

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_deserialize_set_element
          (t_java_generator *this,ostream *out,t_set *tset,string *prefix,string *obj,
          bool has_metadata)

{
  int iVar1;
  ostream *poVar2;
  t_type *ptVar3;
  string i;
  string elem;
  t_field felem;
  string local_1a8;
  string local_188;
  string *local_168;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  t_field local_e0;
  
  local_168 = prefix;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"_elem","");
  t_generator::tmp(&local_188,(t_generator *)this,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  ptVar3 = tset->elem_type_;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_188._M_dataplus._M_p,
             local_188._M_dataplus._M_p + local_188._M_string_length);
  t_field::t_field(&local_e0,ptVar3,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&local_1a8,this,&local_e0,this->reuse_objects_,false);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"_i","");
  t_generator::tmp(&local_1a8,(t_generator *)this,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"for (int ",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = 0; ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," < ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(obj->_M_dataplus)._M_p,obj->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".size",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"++",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  generate_deserialize_field(this,out,&local_e0,&local_160,has_metadata);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  ptVar3 = t_type::get_true_type(local_e0.type_);
  iVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[10])(ptVar3);
  if ((char)iVar1 != '\0') {
    poVar2 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"if (",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != null)",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(local_168->_M_dataplus)._M_p,local_168->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".add(",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar3 = t_type::get_true_type(local_e0.type_);
  iVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[10])(ptVar3);
  if ((char)iVar1 != '\0') {
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  }
  if (this->reuse_objects_ == true) {
    ptVar3 = t_type::get_true_type(local_e0.type_);
    iVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
    if ((char)iVar1 == '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_188._M_dataplus._M_p,local_188._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = null;",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  t_field::~t_field(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_java_generator::generate_deserialize_set_element(ostream& out,
                                                        t_set* tset,
                                                        string prefix,
                                                        string obj,
                                                        bool has_metadata) {
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << declare_field(&felem, reuse_objects_, false) << endl;

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for (int " << i << " = 0; " << i << " < " << obj << ".size"
              << "; "
              << "++" << i << ")" << endl;
  scope_up(out);

  generate_deserialize_field(out, &felem, "", has_metadata);

  if (get_true_type(felem.get_type())->is_enum()) {
    indent(out) << "if (" << elem << " != null)" << endl;
    scope_up(out);
  }

  indent(out) << prefix << ".add(" << elem << ");" << endl;

  if (get_true_type(felem.get_type())->is_enum()) {
    scope_down(out);
  }

  if (reuse_objects_ && !get_true_type(felem.get_type())->is_base_type()) {
    indent(out) << elem << " = null;" << endl;
  }
}